

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> * __thiscall
cmLocalGenerator::AddUnityFilesModeAuto
          (vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *lang,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                   *filtered_sources,cmValue beforeInclude,cmValue afterInclude,
          string *filename_base,size_t batchSize)

{
  pointer pUVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  cmAlphaNum *pcVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  sources;
  string filename;
  string extension;
  unsigned_long local_118;
  string local_110;
  long local_f0;
  cmLocalGenerator *local_e8;
  cmGeneratorTarget *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d8;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  *local_d0;
  undefined1 local_c8 [40];
  undefined8 local_a0;
  size_t local_98;
  string *local_90;
  cmAlphaNum *local_88;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  cmAlphaNum local_68;
  
  uVar3 = (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (batchSize != 0) {
    uVar3 = batchSize;
  }
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    uVar8 = lVar7 >> 5;
    local_f0 = uVar3 << 5;
    lVar7 = 0;
    local_118 = 0;
    local_e8 = this;
    local_e0 = target;
    local_d8 = configs;
    local_d0 = filtered_sources;
    do {
      uVar6 = uVar8;
      if (uVar3 < uVar8) {
        uVar6 = uVar3;
      }
      extension._M_dataplus._M_p = (pointer)&extension.field_2;
      extension._M_string_length = 0;
      extension.field_2._M_local_buf[0] = '\0';
      iVar2 = std::__cxx11::string::compare((char *)lang);
      pcVar4 = "_c.c";
      if (iVar2 == 0) {
LAB_001d1a00:
        std::__cxx11::string::_M_replace
                  ((ulong)&extension,0,(char *)extension._M_string_length,(ulong)pcVar4);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)lang);
        if (iVar2 == 0) {
          pcVar4 = "_cxx.cxx";
          goto LAB_001d1a00;
        }
        iVar2 = std::__cxx11::string::compare((char *)lang);
        pcVar4 = "_m.m";
        if (iVar2 == 0) goto LAB_001d1a00;
        iVar2 = std::__cxx11::string::compare((char *)lang);
        if (iVar2 == 0) {
          pcVar4 = "_mm.mm";
          goto LAB_001d1a00;
        }
      }
      local_c8._8_8_ = (filename_base->_M_dataplus)._M_p;
      local_c8._0_8_ = filename_base->_M_string_length;
      local_c8._16_8_ = 0;
      local_c8._24_8_ = 6;
      local_c8._32_8_ = "unity_";
      local_a0 = 0;
      cmAlphaNum::cmAlphaNum(&local_68,local_118);
      pcVar5 = (cmAlphaNum *)local_68.RValueString_;
      if ((cmAlphaNum *)local_68.RValueString_ == (cmAlphaNum *)0x0) {
        pcVar5 = (cmAlphaNum *)&local_68.View_._M_str;
      }
      local_90 = pcVar5->RValueString_;
      pcVar5 = (cmAlphaNum *)local_68.RValueString_;
      if ((cmAlphaNum *)local_68.RValueString_ == (cmAlphaNum *)0x0) {
        pcVar5 = &local_68;
      }
      local_98 = (pcVar5->View_)._M_len;
      local_88 = (cmAlphaNum *)local_68.RValueString_;
      local_80 = extension._M_string_length;
      local_78 = extension._M_dataplus._M_p;
      local_70 = 0;
      views._M_len = 4;
      views._M_array = (iterator)local_c8;
      cmCatViews(&filename,views);
      pUVar1 = (local_d0->
               super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p == &filename.field_2) {
        local_110.field_2._8_8_ = filename.field_2._8_8_;
      }
      else {
        local_110._M_dataplus._M_p = filename._M_dataplus._M_p;
      }
      local_110.field_2._M_allocated_capacity._1_7_ = filename.field_2._M_allocated_capacity._1_7_;
      local_110.field_2._M_local_buf[0] = filename.field_2._M_local_buf[0];
      sources.End._M_current = (UnityBatchedSource *)((long)&pUVar1[uVar6].Source + lVar7);
      local_110._M_string_length = filename._M_string_length;
      filename._M_string_length = 0;
      filename.field_2._M_local_buf[0] = '\0';
      sources.Begin._M_current = (UnityBatchedSource *)((long)&pUVar1->Source + lVar7);
      filename._M_dataplus._M_p = (pointer)&filename.field_2;
      WriteUnitySource((UnitySource *)local_c8,local_e8,local_e0,local_d8,sources,beforeInclude,
                       afterInclude,&local_110);
      std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
      emplace_back<cmLocalGenerator::UnitySource>(__return_storage_ptr__,(UnitySource *)local_c8);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,
                        CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                 filename.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)extension._M_dataplus._M_p != &extension.field_2) {
        operator_delete(extension._M_dataplus._M_p,
                        CONCAT71(extension.field_2._M_allocated_capacity._1_7_,
                                 extension.field_2._M_local_buf[0]) + 1);
      }
      local_118 = local_118 + 1;
      lVar7 = lVar7 + local_f0;
      uVar8 = uVar8 - uVar6;
    } while (uVar8 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmLocalGenerator::UnitySource>
cmLocalGenerator::AddUnityFilesModeAuto(
  cmGeneratorTarget* target, std::string const& lang,
  std::vector<std::string> const& configs,
  std::vector<UnityBatchedSource> const& filtered_sources,
  cmValue beforeInclude, cmValue afterInclude,
  std::string const& filename_base, size_t batchSize)
{
  if (batchSize == 0) {
    batchSize = filtered_sources.size();
  }

  std::vector<UnitySource> unity_files;
  for (size_t itemsLeft = filtered_sources.size(), chunk, batch = 0;
       itemsLeft > 0; itemsLeft -= chunk, ++batch) {

    chunk = std::min(itemsLeft, batchSize);

    std::string extension;
    if (lang == "C") {
      extension = "_c.c";
    } else if (lang == "CXX") {
      extension = "_cxx.cxx";
    } else if (lang == "OBJC") {
      extension = "_m.m";
    } else if (lang == "OBJCXX") {
      extension = "_mm.mm";
    }
    std::string filename = cmStrCat(filename_base, "unity_", batch, extension);
    auto const begin = filtered_sources.begin() + batch * batchSize;
    auto const end = begin + chunk;
    unity_files.emplace_back(this->WriteUnitySource(
      target, configs, cmMakeRange(begin, end), beforeInclude, afterInclude,
      std::move(filename)));
  }
  return unity_files;
}